

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bst.c
# Opt level: O2

void insert_node(vmd_bst_t *tree,vmd_bst_node_t *node)

{
  byte bVar1;
  vmd_bst_t *pvVar2;
  char cVar3;
  byte bVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  vmd_bst_t *node_00;
  
  node->field_0x20 = node->field_0x20 & 0xf8;
  node->child[0] = (vmd_bst_node_t *)0x0;
  node->child[1] = (vmd_bst_node_t *)0x0;
  uVar7 = 0;
  node_00 = tree;
  while (pvVar2 = (vmd_bst_t *)(node_00->head).child[uVar7], pvVar2 != (vmd_bst_t *)0x0) {
    uVar5 = (*tree->cmp)(&node->field_0x21,&(pvVar2->head).field_0x21);
    node_00 = pvVar2;
    uVar7 = (ulong)(~uVar5 >> 0x1f);
  }
  (node_00->head).child[uVar7] = node;
  fix_child(&node_00->head,(int)uVar7);
  update_to_top(tree,node);
  for (; node_00 != tree; node_00 = (vmd_bst_t *)(node_00->head).parent) {
    cVar3 = '\a';
    if ((int)uVar7 == 0) {
      cVar3 = '\x01';
    }
    bVar1 = (node_00->head).field_0x20;
    bVar4 = cVar3 + bVar1 & 7;
    (node_00->head).field_0x20 = bVar1 & 0xf8 | bVar4;
    if (bVar4 == 0) break;
    iVar6 = rebalance(tree,&node_00->head);
    if (iVar6 != 0) break;
    uVar7 = (ulong)(*(uint *)&(node_00->head).field_0x20 >> 3 & 1);
  }
  if ((node->field_0x20 & 0x10) == 0) {
    node->field_0x20 = node->field_0x20 | 0x10;
    tree->tree_size = tree->tree_size + 1;
    return;
  }
  __assert_fail("!node->in_tree",
                "/workspace/llm4binary/github/license_all_cmakelists_25/an146[P]libvomid/src/bst.c",
                0xe7,"void insert_node(vmd_bst_t *, vmd_bst_node_t *)");
}

Assistant:

static void
insert_node(bst_t *tree, bst_node_t *node)
{
	bst_node_t *i = &tree->head;
	int dir = 0;

	node->balance = 0;
	node->child[0] = node->child[1] = NULL;

	while (i->child[dir] != NULL) {
		i = i->child[dir];
		dir = (tree->cmp(node->data, i->data) >= 0);
	}

	set_child(i, dir, node);
	update_to_top(tree, node);

	for (; i != &tree->head; i = i->parent) {
		i->balance += (dir ? -1 : 1);
		if (i->balance == 0 || rebalance(tree, i))
			break;
		dir = i->idx;
	}

	assert(!node->in_tree);
	node->in_tree = 1;
	tree->tree_size++;
}